

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_strategies.cpp
# Opt level: O3

uint32 __thiscall Clasp::ReduceParams::getBase(ReduceParams *this,SharedContext *ctx)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  if (((uint)this->strategy & 0x60000000) != 0 || (ctx->stats_).vars.frozen != 0) {
    switch((uint)this->strategy >> 0x1d & 3) {
    case 0:
      uVar1 = (ctx->stats_).vars.num;
      uVar2 = (ctx->stats_).constraints.binary + (ctx->stats_).constraints.other +
              (ctx->stats_).constraints.ternary;
      uVar3 = uVar2;
      if (uVar2 < uVar1) {
        uVar3 = uVar1;
        uVar1 = uVar2;
      }
      if (uVar3 <= uVar1 * 10) {
        uVar3 = uVar1;
      }
      return uVar3;
    case 1:
      return (ctx->stats_).complexity;
    case 3:
      return (ctx->stats_).vars.num;
    }
  }
  return (ctx->stats_).constraints.binary + (ctx->stats_).constraints.other +
         (ctx->stats_).constraints.ternary;
}

Assistant:

uint32 ReduceParams::getBase(const SharedContext& ctx) const {
	uint32 st = strategy.estimate != ReduceStrategy::est_dynamic || ctx.isExtended() ? strategy.estimate : (uint32)ReduceStrategy::est_num_constraints;
	switch(st) {
		default:
		case ReduceStrategy::est_dynamic        : {
			uint32 m = std::min(ctx.stats().vars.num, ctx.stats().numConstraints());
			uint32 M = std::max(ctx.stats().vars.num, ctx.stats().numConstraints());
			return M > (m * 10) ? M : m;
		}
		case ReduceStrategy::est_con_complexity : return ctx.stats().complexity;
		case ReduceStrategy::est_num_constraints: return ctx.stats().numConstraints();
		case ReduceStrategy::est_num_vars       : return ctx.stats().vars.num;
	}
}